

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int int256is127(uint16_t *v)

{
  bool bVar1;
  bool bVar2;
  bool local_15;
  int i;
  int all_1;
  int all_0;
  uint16_t *v_local;
  
  bVar1 = (v[7] & 0x8000) == 0;
  bVar2 = (v[7] & 0x8000) == 0x8000;
  for (i = 8; i < 0x10; i = i + 1) {
    if (v[i] != 0) {
      bVar1 = false;
    }
    if (v[i] != 0xffff) {
      bVar2 = false;
    }
  }
  local_15 = true;
  if (!bVar1) {
    local_15 = bVar2;
  }
  return (int)local_15;
}

Assistant:

static int int256is127(const uint16_t* v) {
    int all_0 = ((v[7] & 0x8000) == 0), all_1 = ((v[7] & 0x8000) == 0x8000);
    int i;
    for (i = 8; i < 16; ++i) {
        if (v[i] != 0) all_0 = 0;
        if (v[i] != 0xffff) all_1 = 0;
    }
    return all_0 || all_1;
}